

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O2

unique_ptr<Catch::Generators::SingleValueGenerator<long>_> __thiscall
Catch::Detail::make_unique<Catch::Generators::SingleValueGenerator<long>,long>
          (Detail *this,long *args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = 0;
  *puVar1 = &PTR_next_003cc4a0;
  puVar1[6] = *args;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<Catch::Generators::SingleValueGenerator<long>_>)
         (SingleValueGenerator<long> *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }